

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyz::Relax(ChNodeFEAxyz *this)

{
  double dVar1;
  
  dVar1 = *(double *)&this->field_0x28;
  (this->X0).m_data[0] = *(double *)&(this->super_ChNodeFEAbase).field_0x20;
  (this->X0).m_data[1] = dVar1;
  (this->X0).m_data[2] = *(double *)&this->field_0x30;
  (*(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[1])();
  return;
}

Assistant:

inline ChVector<Real>& ChVector<Real>::operator=(const ChVector<Real>& other) {
    if (&other == this)
        return *this;
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
    return *this;
}